

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int CreateNailBombFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  VMFunctionBuilder::Emit(buildit,0x46,0,0x80,0);
  VMFunctionBuilder::Emit(buildit,0x46,0,0x80,0);
  VMFunctionBuilder::Emit(buildit,0x46,0,0x80,0);
  VMFunctionBuilder::Emit(buildit,0x46,0,0x80,0);
  VMFunctionBuilder::Emit(buildit,0x46,0,0x80,0);
  VMFunctionBuilder::Emit(buildit,0x47,0x1e);
  VMFunctionBuilder::Emit(buildit,0x47,10);
  return 7;
}

Assistant:

static int CreateNailBombFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_Explode
	// This one does not actually have MBF-style parameters. But since
	// we're aliasing it to an extension of A_Explode...
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);			// damage
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);			// distance
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);			// flags
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);			// alert
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);			// fulldamagedistance
	buildit.Emit(OP_PARAMI, 30);					// nails
	buildit.Emit(OP_PARAMI, 10);					// naildamage
	return 7;
}